

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_getEndpoints
          (UA_Client *client,char *serverUrl,size_t *endpointDescriptionsSize,
          UA_EndpointDescription **endpointDescriptions)

{
  char *pcVar1;
  UA_String UVar2;
  size_t local_e8;
  UA_Byte *local_e0;
  undefined1 local_c0 [140];
  UA_StatusCode local_34;
  UA_EndpointDescription **ppUStack_30;
  UA_StatusCode retval;
  UA_EndpointDescription **endpointDescriptions_local;
  size_t *endpointDescriptionsSize_local;
  char *serverUrl_local;
  UA_Client *client_local;
  
  if (client->state == UA_CLIENTSTATE_CONNECTED) {
    client_local._4_4_ = 0;
  }
  else {
    ppUStack_30 = endpointDescriptions;
    endpointDescriptions_local = (UA_EndpointDescription **)endpointDescriptionsSize;
    endpointDescriptionsSize_local = (size_t *)serverUrl;
    serverUrl_local = (char *)client;
    if (client->state == UA_CLIENTSTATE_ERRORED) {
      UA_Client_reset(client);
    }
    local_34 = 0;
    pcVar1 = serverUrl_local + 0x38;
    (**(code **)(serverUrl_local + 0x30))
              (local_c0,endpointDescriptionsSize_local,*(undefined8 *)(serverUrl_local + 0x10));
    memcpy(pcVar1,local_c0,0x88);
    pcVar1 = serverUrl_local;
    if (*(int *)(serverUrl_local + 0x38) == 0) {
      UVar2 = UA_String_fromChars((char *)endpointDescriptionsSize_local);
      local_e8 = UVar2.length;
      *(size_t *)(pcVar1 + 0xc0) = local_e8;
      local_e0 = UVar2.data;
      *(UA_Byte **)(pcVar1 + 200) = local_e0;
      if (*(long *)(serverUrl_local + 200) == 0) {
        local_34 = 0x80030000;
      }
      else {
        *(undefined8 *)(serverUrl_local + 0x3c) = *(undefined8 *)(serverUrl_local + 0x18);
        *(undefined8 *)(serverUrl_local + 0x44) = *(undefined8 *)(serverUrl_local + 0x20);
        *(undefined4 *)(serverUrl_local + 0x4c) = *(undefined4 *)(serverUrl_local + 0x28);
        local_34 = HelAckHandshake((UA_Client *)serverUrl_local);
        if (local_34 == 0) {
          local_34 = SecureChannelHandshake((UA_Client *)serverUrl_local,false);
        }
        if (local_34 == 0) {
          local_34 = GetEndpoints((UA_Client *)serverUrl_local,(size_t *)endpointDescriptions_local,
                                  ppUStack_30);
        }
      }
    }
    else {
      local_34 = 0x80ae0000;
    }
    UA_Client_disconnect((UA_Client *)serverUrl_local);
    UA_Client_reset((UA_Client *)serverUrl_local);
    client_local._4_4_ = local_34;
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_getEndpoints(UA_Client *client, const char *serverUrl,
                       size_t* endpointDescriptionsSize,
                       UA_EndpointDescription** endpointDescriptions) {
    if(client->state == UA_CLIENTSTATE_CONNECTED)
        return UA_STATUSCODE_GOOD;
    if(client->state == UA_CLIENTSTATE_ERRORED)
        UA_Client_reset(client);


    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    client->connection =
        client->config.connectionFunc(UA_ConnectionConfig_standard, serverUrl,
                                      client->config.logger);
    if(client->connection.state != UA_CONNECTION_OPENING) {
        retval = UA_STATUSCODE_BADCONNECTIONCLOSED;
        goto cleanup;
    }

    client->endpointUrl = UA_STRING_ALLOC(serverUrl);
    if(!client->endpointUrl.data) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    client->connection.localConf = client->config.localConnectionConfig;
    retval = HelAckHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SecureChannelHandshake(client, false);
    if(retval == UA_STATUSCODE_GOOD)
        retval = GetEndpoints(client, endpointDescriptionsSize, endpointDescriptions);

    /* always cleanup */
 cleanup:
    UA_Client_disconnect(client);
    UA_Client_reset(client);
    return retval;
}